

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

gdImagePtr gdImageRotateGeneric(gdImagePtr src,float degrees,int bgColor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  gdImagePtr pgVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  gdRect bbox;
  gdRect local_40;
  
  iVar1 = src->sx;
  iVar2 = src->sy;
  dVar13 = (double)((degrees / -180.0) * -3.1415927);
  dVar14 = cos(dVar13);
  dVar13 = sin(dVar13);
  if (-1 < bgColor) {
    if (src->interpolation == (interpolation_method)0x0) {
      src->interpolation = filter_linear;
    }
    gdRotatedImageSize(src,degrees,&local_40);
    pgVar4 = gdImageCreateTrueColor(local_40.width,local_40.height);
    if (pgVar4 != (gdImagePtr)0x0) {
      pgVar4->saveAlphaFlag = 1;
      if ((ulong)(uint)local_40.height == 0) {
        return pgVar4;
      }
      uVar10 = 0;
      do {
        if ((ulong)(uint)local_40.width != 0) {
          lVar5 = (long)(((int)uVar10 - local_40.height / 2) * 0x100);
          uVar11 = 0;
          iVar12 = ((uint)(local_40.width - (local_40.width >> 0x1f)) >> 1) * -0x100;
          do {
            lVar6 = ((long)iVar12 * (long)(dVar13 * 256.0) >> 8) +
                    (lVar5 * (long)(dVar14 * 256.0) >> 8) +
                    (long)(int)((((uint)((ulong)(long)iVar2 >> 0x1f) & 1) + iVar2 & 0xfffffffe) << 7
                               );
            lVar8 = lVar6 >> 8;
            iVar3 = bgColor;
            if (-2 < lVar8) {
              lVar7 = (((long)iVar12 * (long)(dVar14 * 256.0) >> 8) -
                      (lVar5 * (long)(dVar13 * 256.0) >> 8)) +
                      (long)(int)((((uint)((ulong)(long)iVar1 >> 0x1f) & 1) + iVar1 & 0xfffffffe) <<
                                 7);
              lVar9 = lVar7 >> 8;
              if (((-2 < lVar9) && (lVar8 < iVar2)) && (lVar9 < iVar1)) {
                iVar3 = getPixelInterpolated
                                  (src,(double)lVar7 * 0.00390625,(double)lVar6 * 0.00390625,bgColor
                                  );
              }
            }
            pgVar4->tpixels[uVar10][uVar11] = iVar3;
            uVar11 = uVar11 + 1;
            iVar12 = iVar12 + 0x100;
          } while ((uint)local_40.width != uVar11);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)local_40.height);
      return pgVar4;
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

static gdImagePtr
gdImageRotateGeneric(gdImagePtr src, const float degrees, const int bgColor)
{
	float _angle = ((float) (-degrees / 180.0f) * (float)M_PI);
	const int src_w  = gdImageSX(src);
	const int src_h = gdImageSY(src);
	const gdFixed f_H = gd_itofx(src_h/2);
	const gdFixed f_W = gd_itofx(src_w/2);
	const gdFixed f_cos = gd_ftofx(cos(-_angle));
	const gdFixed f_sin = gd_ftofx(sin(-_angle));

	unsigned int dst_offset_x;
	unsigned int dst_offset_y = 0;
	unsigned int i;
	gdImagePtr dst;
	int new_width, new_height;
	gdRect bbox;

	if (bgColor < 0) {
		return NULL;
	}

	if (src->interpolation == NULL) {
		gdImageSetInterpolationMethod(src, GD_DEFAULT);
	}

    gdRotatedImageSize(src, degrees, &bbox);
    new_width = bbox.width;
    new_height = bbox.height;

	dst = gdImageCreateTrueColor(new_width, new_height);
	if (!dst) {
		return NULL;
	}
	dst->saveAlphaFlag = 1;

	for (i = 0; i < new_height; i++) {
		unsigned int j;
		dst_offset_x = 0;
		for (j = 0; j < new_width; j++) {
			gdFixed f_i = gd_itofx((int)i - (int)new_height / 2);
			gdFixed f_j = gd_itofx((int)j - (int)new_width  / 2);
			gdFixed f_m = gd_mulfx(f_j,f_sin) + gd_mulfx(f_i,f_cos) + f_H;
			gdFixed f_n = gd_mulfx(f_j,f_cos) - gd_mulfx(f_i,f_sin)  + f_W;
			long m = gd_fxtoi(f_m);
			long n = gd_fxtoi(f_n);

			if (m < -1 || n < -1 || m >= src_h || n >= src_w ) {
				dst->tpixels[dst_offset_y][dst_offset_x++] = bgColor;
			} else {
				dst->tpixels[dst_offset_y][dst_offset_x++] = getPixelInterpolated(src, gd_fxtod(f_n), gd_fxtod(f_m), bgColor);
			}
		}
		dst_offset_y++;
	}
	return dst;
}